

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O0

double __thiscall libcalc::Tokenizer::evaluate(Tokenizer *this)

{
  value_type vVar1;
  bool bVar2;
  int iVar3;
  reference ppTVar4;
  undefined1 *puVar5;
  char *__nptr;
  reference pvVar6;
  double local_d0;
  Token *local_c8;
  Token *t;
  iterator __end1;
  iterator __begin1;
  vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> local_a0;
  vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *local_88;
  vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *__range1;
  value_type vStack_78;
  char o;
  double r;
  double a;
  double l;
  stack<double,_std::deque<double,_std::allocator<double>_>_> temp;
  Tokenizer *this_local;
  
  temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_node = (_Map_pointer)this;
  std::stack<double,std::deque<double,std::allocator<double>>>::
  stack<std::deque<double,std::allocator<double>>,void>
            ((stack<double,std::deque<double,std::allocator<double>>> *)&l);
  toRPN(&local_a0,this);
  local_88 = &local_a0;
  __end1 = std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::begin(local_88);
  t = (Token *)std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::end(local_88);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<libcalc::Token_**,_std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                                     *)&t), bVar2) {
    ppTVar4 = __gnu_cxx::
              __normal_iterator<libcalc::Token_**,_std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
              ::operator*(&__end1);
    local_c8 = *ppTVar4;
    if (local_c8->type == '\x01') {
      pvVar6 = std::stack<double,_std::deque<double,_std::allocator<double>_>_>::top
                         ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&l);
      vStack_78 = *pvVar6;
      std::stack<double,_std::deque<double,_std::allocator<double>_>_>::pop
                ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&l);
      puVar5 = (undefined1 *)std::__cxx11::string::c_str();
      __range1._7_1_ = *puVar5;
      pvVar6 = std::stack<double,_std::deque<double,_std::allocator<double>_>_>::top
                         ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&l);
      a = *pvVar6;
      std::stack<double,_std::deque<double,_std::allocator<double>_>_>::pop
                ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&l);
      switch(__range1._7_1_) {
      case 0x21:
        iVar3 = factorial((int)vStack_78);
        r = (double)iVar3;
        break;
      case 0x25:
        r = (double)((int)a % (int)vStack_78);
        break;
      case 0x2a:
        r = a * vStack_78;
        break;
      case 0x2b:
        r = a + vStack_78;
        break;
      case 0x2d:
        r = a - vStack_78;
        break;
      case 0x2f:
        r = a / vStack_78;
        break;
      case 0x5e:
        r = (double)((int)a ^ (int)vStack_78);
      }
      std::stack<double,_std::deque<double,_std::allocator<double>_>_>::push
                ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&l,&r);
    }
    else {
      __nptr = (char *)std::__cxx11::string::c_str();
      local_d0 = atof(__nptr);
      std::stack<double,_std::deque<double,_std::allocator<double>_>_>::push
                ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&l,&local_d0);
    }
    __gnu_cxx::
    __normal_iterator<libcalc::Token_**,_std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::~vector(&local_a0);
  pvVar6 = std::stack<double,_std::deque<double,_std::allocator<double>_>_>::top
                     ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&l);
  vVar1 = *pvVar6;
  std::stack<double,_std::deque<double,_std::allocator<double>_>_>::~stack
            ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&l);
  return vVar1;
}

Assistant:

double Tokenizer::evaluate() {
  std::stack<double> temp;
  double l, a, r;
  char o;

  for (Token *t : toRPN()) {
    if (t->type == TOKEN_TYPE.OPERATOR) {

      r = temp.top();
      temp.pop();

      o = t->value.c_str()[0];

      l = temp.top();
      temp.pop();

      switch(o) {
        case '+': a =  l + r ; break;
        case '-': a =  l - r ; break;
        case '*': a =  l * r ; break;
        case '/': a =  l / r ; break;
        case '%': a =  (int)l % (int) r ; break;
        case '^': a =  (int)l ^ (int)r ; break;
        case '!': a =  factorial(r) ; break;
      }

      temp.push(a);

    } else {
      temp.push(std::atof(t->value.c_str()));
    }
  }

  return temp.top();
}